

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::NonPackedFixed32::_InternalSerialize
          (NonPackedFixed32 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint8_t *puVar2;
  const_reference puVar3;
  ulong uVar4;
  int index;
  
  iVar1 = google::protobuf::RepeatedField<unsigned_int>::size
                    (&(this->field_0)._impl_.repeated_fixed32_);
  index = 0;
  if (iVar1 < 1) {
    iVar1 = index;
  }
  for (; iVar1 != index; index = index + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get
                       (&(this->field_0)._impl_.repeated_fixed32_,index);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray(0x800,*puVar3,puVar2);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  uVar4 = uVar4 & 0xfffffffffffffffe;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL NonPackedFixed32::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const NonPackedFixed32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.NonPackedFixed32)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated fixed32 repeated_fixed32 = 2048;
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        2048, this_._internal_repeated_fixed32().Get(i), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.NonPackedFixed32)
  return target;
}